

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O0

int google::protobuf::io::anon_unknown_0::BlockSizes_BigLimitOnTopOfSmallLimit_Test::AddToRegistry
              (void)

{
  UnitTest *this;
  ParameterizedTestSuiteRegistry *this_00;
  ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::BlockSizes> *this_01;
  TestMetaFactoryBase<int> *meta_factory;
  allocator<char> local_d9;
  string local_d8;
  CodeLocation local_b8;
  allocator<char> local_89;
  string local_88;
  CodeLocation local_68;
  allocator<char> local_29;
  string local_28;
  
  this = testing::UnitTest::GetInstance();
  this_00 = testing::UnitTest::parameterized_test_registry(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"BlockSizes",&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
             ,&local_89);
  testing::internal::CodeLocation::CodeLocation(&local_68,&local_88,0x548);
  this_01 = testing::internal::ParameterizedTestSuiteRegistry::
            GetTestSuitePatternHolder<google::protobuf::io::(anonymous_namespace)::BlockSizes>
                      (this_00,&local_28,&local_68);
  meta_factory = (TestMetaFactoryBase<int> *)operator_new(8);
  meta_factory->_vptr_TestMetaFactoryBase = (_func_int **)0x0;
  testing::internal::
  TestMetaFactory<google::protobuf::io::(anonymous_namespace)::BlockSizes_BigLimitOnTopOfSmallLimit_Test>
  ::TestMetaFactory((TestMetaFactory<google::protobuf::io::(anonymous_namespace)::BlockSizes_BigLimitOnTopOfSmallLimit_Test>
                     *)meta_factory);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
             ,&local_d9);
  testing::internal::CodeLocation::CodeLocation(&local_b8,&local_d8,0x548);
  testing::internal::
  ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::BlockSizes>::
  AddTestPattern(this_01,"BlockSizes","BigLimitOnTopOfSmallLimit",meta_factory,&local_b8);
  testing::internal::CodeLocation::~CodeLocation(&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  testing::internal::CodeLocation::~CodeLocation(&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::~string((string *)&local_28);
  std::allocator<char>::~allocator(&local_29);
  return 0;
}

Assistant:

TEST_P(BlockSizes, BigLimitOnTopOfSmallLimit) {
  int kBlockSizes_case = GetParam();
  ArrayInputStream input(buffer_, sizeof(buffer_), kBlockSizes_case);

  {
    CodedInputStream coded_input(&input);

    EXPECT_EQ(-1, coded_input.BytesUntilLimit());
    CodedInputStream::Limit limit1 = coded_input.PushLimit(4);
    EXPECT_EQ(4, coded_input.BytesUntilLimit());
    CodedInputStream::Limit limit2 = coded_input.PushLimit(8);

    uint32_t value;

    // Read until we hit limit2.  Except, wait!  limit1 is shorter, so
    // we end up hitting that first, despite having 4 bytes to go on
    // limit2.
    EXPECT_EQ(4, coded_input.BytesUntilLimit());
    EXPECT_TRUE(coded_input.ReadLittleEndian32(&value));
    EXPECT_EQ(0, coded_input.BytesUntilLimit());
    EXPECT_FALSE(coded_input.ReadLittleEndian32(&value));
    EXPECT_EQ(0, coded_input.BytesUntilLimit());

    coded_input.PopLimit(limit2);

    // OK, popped limit2, now limit1 is on top, which we've already hit.
    EXPECT_EQ(0, coded_input.BytesUntilLimit());
    EXPECT_FALSE(coded_input.ReadLittleEndian32(&value));
    EXPECT_EQ(0, coded_input.BytesUntilLimit());

    coded_input.PopLimit(limit1);

    // No more limits.
    EXPECT_EQ(-1, coded_input.BytesUntilLimit());
    EXPECT_TRUE(coded_input.ReadLittleEndian32(&value));
  }

  EXPECT_EQ(8, input.ByteCount());
}